

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_tree.h
# Opt level: O3

size_t dicroce::blob_tree::_write_treeb(blob_tree *rt,uint8_t *p,uint8_t *end)

{
  uint8_t *__dest;
  blob_tree *pbVar1;
  ushort uVar2;
  uint uVar3;
  size_t sVar5;
  _Rb_tree_node_base *p_Var6;
  runtime_error *this;
  ulong uVar7;
  const_iterator __end4;
  const_iterator __begin4;
  blob_tree *rt_00;
  ushort *puVar8;
  int iVar4;
  
  if ((ulong)((long)end - (long)p) < 5) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
    goto LAB_001046a2;
  }
  if ((rt->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if ((rt->_childrenByIndex).
        super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (rt->_childrenByIndex).
        super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      *p = '\x02';
      if ((ulong)((long)end - (long)(p + 1)) < 4) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
      }
      else {
        uVar7 = (rt->_payload).first;
        uVar3 = (uint)uVar7;
        uVar7 = uVar7 & 0xffffffff;
        *(uint *)(p + 1) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        __dest = p + 5;
        if (uVar7 <= (ulong)((long)end - (long)__dest)) {
          memcpy(__dest,(rt->_payload).second,uVar7);
          puVar8 = (ushort *)(__dest + uVar7);
          goto LAB_00104653;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
      }
LAB_001046a2:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *p = '\x01';
    rt_00 = (rt->_childrenByIndex).
            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
            super__Vector_impl_data._M_start;
    pbVar1 = (rt->_childrenByIndex).
             super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = (int)((ulong)((long)pbVar1 - (long)rt_00) >> 3);
    uVar3 = iVar4 * -0x45d1745d;
    puVar8 = (ushort *)(p + 5);
    *(uint *)(p + 1) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | iVar4 * -0x5d000000;
    for (; pbVar1 != rt_00; rt_00 = rt_00 + 1) {
      sVar5 = _write_treeb(rt_00,(uint8_t *)puVar8,end);
      puVar8 = (ushort *)((long)puVar8 + sVar5);
    }
  }
  else {
    *p = '\0';
    uVar3 = (uint)(rt->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *(uint *)(p + 1) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    puVar8 = (ushort *)(p + 5);
    for (p_Var6 = (rt->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(rt->_children)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if ((ulong)((long)end - (long)puVar8) < 2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
        goto LAB_001046a2;
      }
      uVar7 = (ulong)p_Var6[1]._M_parent & 0xffff;
      uVar2 = (ushort)p_Var6[1]._M_parent;
      *puVar8 = uVar2 << 8 | uVar2 >> 8;
      puVar8 = puVar8 + 1;
      if ((ulong)((long)end - (long)puVar8) < uVar7) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
        goto LAB_001046a2;
      }
      memcpy(puVar8,*(void **)(p_Var6 + 1),uVar7);
      sVar5 = _write_treeb((blob_tree *)(p_Var6 + 2),(uint8_t *)((long)puVar8 + uVar7),end);
      puVar8 = (ushort *)((uint8_t *)((long)puVar8 + uVar7) + sVar5);
    }
  }
LAB_00104653:
  return (long)puVar8 - (long)p;
}

Assistant:

inline static size_t _bytes_left(const uint8_t* p, const uint8_t* end) { return end - p; }